

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O3

void undo_moves(node *newest_node,Pyraminx *pyraminx)

{
  pointer pmVar1;
  vector<move_type,_std::allocator<move_type>_> move_list;
  vector<move_type,_std::allocator<move_type>_> local_30;
  
  get_move_list(&local_30,newest_node);
  for (pmVar1 = local_30.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                super__Vector_impl_data._M_start;
      pmVar1 != local_30.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                super__Vector_impl_data._M_finish; pmVar1 = pmVar1 + 1) {
    Pyraminx::turn_layer(pyraminx,pmVar1->ref_corner,pmVar1->layer,(uint)(pmVar1->dir == clockwise))
    ;
  }
  if (local_30.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void undo_moves(const node* newest_node, Pyraminx& pyraminx){
    Direction undo_dir;
    std::vector<move_type> move_list = get_move_list(newest_node);
    for(move_type move : move_list){
        if (move.dir == Direction::clockwise){
            undo_dir = Direction::counterclockwise;
        }
        else{
            undo_dir = Direction::clockwise;
        }
        pyraminx.turn_layer(move.ref_corner, move.layer, undo_dir);
    }
}